

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O1

Varnode * __thiscall VarnodeBank::setInput(VarnodeBank *this,Varnode *vn)

{
  uint4 *puVar1;
  Varnode *pVVar2;
  LowlevelError *pLVar3;
  string local_40;
  
  if ((vn->flags & 0x18) != 0) {
    pLVar3 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Making input out of varnode which is not free","");
    LowlevelError::LowlevelError(pLVar3,&local_40);
    __cxa_throw(pLVar3,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if ((vn->flags & 2) == 0) {
    std::
    _Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareLocDef,std::allocator<Varnode*>>
    ::erase_abi_cxx11_((_Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareLocDef,std::allocator<Varnode*>>
                        *)&this->loc_tree,(vn->lociter)._M_node);
    std::
    _Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareDefLoc,std::allocator<Varnode*>>
    ::erase_abi_cxx11_((_Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareDefLoc,std::allocator<Varnode*>>
                        *)&this->def_tree,(vn->defiter)._M_node);
    vn->flags = vn->flags | 0x2000008;
    if (vn->high != (HighVariable *)0x0) {
      puVar1 = &vn->high->highflags;
      *(byte *)puVar1 = (byte)*puVar1 | 5;
    }
    pVVar2 = xref(this,vn);
    return pVVar2;
  }
  pLVar3 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Making input out of constant varnode","");
  LowlevelError::LowlevelError(pLVar3,&local_40);
  __cxa_throw(pLVar3,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void Varnode::clearCover(void) const

{
  if (cover != (Cover *)0) {
    delete cover;
    cover = (Cover *)0;
  }
}